

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.h
# Opt level: O0

void SHA1_input(SHA1_CTX *context,uchar *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  uint32_t j;
  uint32_t i;
  uchar *in_stack_00000038;
  uint32_t *in_stack_00000040;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_1c = 0;
  uVar1 = *(uint *)(in_RDI + 0x14);
  uVar2 = *(int *)(in_RDI + 0x14) + (int)(in_RDX << 3);
  *(uint *)(in_RDI + 0x14) = uVar2;
  if (uVar2 < uVar1) {
    *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
  }
  *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + (int)(in_RDX >> 0x1d);
  local_20 = uVar1 >> 3 & 0x3f;
  if (0x3f < local_20 + in_RDX) {
    local_1c = 0x40 - local_20;
    memcpy((void *)(in_RDI + 0x1c + (ulong)local_20),in_RSI,(ulong)local_1c);
    SHA1_transform(in_stack_00000040,in_stack_00000038);
    for (; local_1c + 0x3f < in_RDX; local_1c = local_1c + 0x40) {
      SHA1_transform(in_stack_00000040,in_stack_00000038);
    }
    local_20 = 0;
  }
  memcpy((void *)(in_RDI + 0x1c + (ulong)local_20),(void *)((long)in_RSI + (ulong)local_1c),
         in_RDX - local_1c);
  return;
}

Assistant:

void SHA1_input(SHA1_CTX* context, const unsigned char* data, size_t len)
{
	uint32_t i = 0;
	uint32_t j = context->count[0];

	if ((context->count[0] += len << 3) < j)
		context->count[1]++;

	context->count[1] += (len >> 29);
	j = (j >> 3) & 63;

	if ((j + len) > 63)
	{
		memcpy(&context->buffer[j], data, (i = 64 - j));
		SHA1_transform(context->state, context->buffer);

		for (; i + 63 < len; i += 64)
			SHA1_transform(context->state, &data[i]);

		j = 0;
	}

	memcpy(&context->buffer[j], &data[i], len - i);
}